

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O2

void uavs3d_img_cpy_cvt(uavs3d_io_frm_t *dst,uavs3d_io_frm_t *src,int bit_depth)

{
  (*(&uavs3d_funs_handle.conv_fmt_8bit)[bit_depth == 10])
            ((uchar *)src->buffer[0],(uchar *)src->buffer[1],(uchar **)dst->buffer,src->width[0],
             src->height[0],src->stride[0],src->stride[1],dst->stride,1);
  return;
}

Assistant:

void __cdecl uavs3d_img_cpy_cvt(uavs3d_io_frm_t * dst, uavs3d_io_frm_t * src, int bit_depth)
{
    if (bit_depth == 10) {
        uavs3d_funs_handle.conv_fmt_16bit((unsigned char*)src->buffer[0], (unsigned char*)src->buffer[1], (unsigned char**)dst->buffer, src->width[0], src->height[0],
            src->stride[0], src->stride[1], dst->stride, 1);
    } else { // the output reconstructed file is 8-bit storage for 8-bit depth
#if (BIT_DEPTH == 8)
        uavs3d_funs_handle.conv_fmt_8bit((unsigned char*)src->buffer[0], (unsigned char*)src->buffer[1], (unsigned char**)dst->buffer, src->width[0], src->height[0],
            src->stride[0], src->stride[1], dst->stride, 1);
#else
        uavs3d_funs_handle.conv_fmt_16to8bit((unsigned char*)src->buffer[0], (unsigned char*)src->buffer[1], (unsigned char**)dst->buffer, src->width[0], src->height[0],
            src->stride[0], src->stride[1], dst->stride, 1);
#endif
    }
}